

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReader.cpp
# Opt level: O2

uint8_t * __thiscall
BufferedReader::readBlock
          (BufferedReader *this,int readerID,uint32_t *readCnt,int *rez,bool *firstBlockVar)

{
  int *piVar1;
  _Rb_tree_header *p_Var2;
  byte bVar3;
  uint32_t uVar4;
  iterator iVar5;
  uint8_t *puVar6;
  uint32_t uVar7;
  _Base_ptr unaff_RBX;
  unique_lock<std::mutex> lk;
  int local_54;
  uint *local_50;
  bool *local_48;
  unique_lock<std::mutex> local_40;
  
  local_54 = readerID;
  local_50 = (uint *)rez;
  local_48 = firstBlockVar;
  std::mutex::lock(&this->m_readersMtx);
  iVar5 = std::
          _Rb_tree<int,_std::pair<const_int,_ReaderData_*>,_std::_Select1st<std::pair<const_int,_ReaderData_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_ReaderData_*>_>_>
          ::find(&(this->m_readers)._M_t,&local_54);
  p_Var2 = &(this->m_readers)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar5._M_node == p_Var2) {
    *local_50 = 3;
    *readCnt = 0;
  }
  else {
    unaff_RBX = iVar5._M_node[1]._M_parent;
    if ((*(int *)((long)&unaff_RBX->_M_parent + 4) == 0) &&
       (*(char *)((long)&unaff_RBX->_M_parent + 1) == '\0')) {
      *(undefined1 *)((long)&unaff_RBX->_M_parent + 1) = 1;
      piVar1 = (int *)((long)&unaff_RBX->_M_left + 4);
      *piVar1 = *piVar1 + 1;
      SafeQueueWithNotification<int>::push
                (&(this->m_readQueue).super_SafeQueueWithNotification<int>,&local_54);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_readersMtx);
  if ((_Rb_tree_header *)iVar5._M_node == p_Var2) {
    puVar6 = (uint8_t *)0x0;
  }
  else {
    uVar4 = *(uint32_t *)((long)&unaff_RBX->_M_parent + 4);
    if (uVar4 == 0) {
      std::unique_lock<std::mutex>::unique_lock(&local_40,&this->m_readMtx);
      while ((*(int *)((long)&unaff_RBX->_M_parent + 4) == 0 &&
             (*(char *)((long)&unaff_RBX->_M_left + 3) == '\0'))) {
        std::condition_variable::wait((unique_lock *)&this->m_readCond);
      }
      std::unique_lock<std::mutex>::~unique_lock(&local_40);
      uVar4 = *(uint32_t *)((long)&unaff_RBX->_M_parent + 4);
    }
    uVar7 = 0;
    if (0 < (int)uVar4) {
      uVar7 = uVar4;
    }
    *readCnt = uVar7;
    *local_50 = (uint)*(byte *)((long)&unaff_RBX->_M_left + 3);
    bVar3 = *(byte *)&unaff_RBX->_M_parent;
    *(byte *)&unaff_RBX->_M_parent = '\x01' - bVar3;
    *(undefined4 *)((long)&unaff_RBX->_M_parent + 4) = 0;
    *(undefined1 *)((long)&unaff_RBX->_M_parent + 1) = 0;
    if (local_48 != (bool *)0x0) {
      *local_48 = *(bool *)((long)&unaff_RBX->_M_left + 1);
    }
    puVar6 = *(uint8_t **)(&unaff_RBX[1]._M_color + (ulong)bVar3 * 2);
  }
  return puVar6;
}

Assistant:

uint8_t* BufferedReader::readBlock(const int readerID, uint32_t& readCnt, int& rez, bool* firstBlockVar)
{
    ReaderData* data;
    {
        std::lock_guard lock(m_readersMtx);
        const auto itr = m_readers.find(readerID);
        if (itr != m_readers.end())
        {
            data = itr->second;
            if (!data->m_nextBlockSize && !data->m_notified)
            {  // No fragments of this block found, and no requests for reading this block
                data->m_notified = true;
                data->m_atQueue++;
                m_readQueue.push(readerID);
            }
        }
        else
        {
            rez = UNKNOWN_READERID;
            readCnt = 0;
            return nullptr;
        }
    }

    if (!data->m_nextBlockSize)
    {
        std::unique_lock lk(m_readMtx);
        while (data->m_nextBlockSize == 0 && !data->m_eof) m_readCond.wait(lk);
    }
    readCnt = data->m_nextBlockSize >= 0 ? data->m_nextBlockSize : 0;
    rez = data->m_eof ? DATA_EOF : NO_ERROR;
    const uint8_t prevIndex = data->m_bufferIndex;
    data->m_bufferIndex = 1 - data->m_bufferIndex;
    data->m_nextBlockSize = 0;
    data->m_notified = false;
    if (firstBlockVar)
        *firstBlockVar = data->m_firstBlock;
    return data->m_nextBlock[prevIndex];
}